

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
find<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry_const,capnp::Text::Reader&>
          (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table,
          Reader *params)

{
  RawBrandedSchema *pRVar1;
  ulong uVar2;
  void *__s2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  RawSchema **ppRVar6;
  long lVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 __n;
  Entry *pEVar8;
  undefined8 *in_R8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  Maybe<unsigned_long> MVar12;
  Maybe<unsigned_long> MVar13;
  ArrayPtr<const_unsigned_char> s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  
  MVar12.ptr.field_1.value = table.size_;
  pEVar8 = table.ptr;
  if (*(long *)&(pEVar8->value).index == 0) {
    *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0;
    MVar12.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar12.ptr;
  }
  s.size_ = in_R8[1] - 1;
  s.ptr = (uchar *)*in_R8;
  uVar4 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  pRVar1 = (pEVar8->value).parent.super_Schema.raw;
  uVar2 = *(ulong *)&(pEVar8->value).index;
  uVar11 = (ulong)((int)uVar2 - 1U & uVar4);
  uVar9 = *(uint *)((long)&pRVar1->generic + uVar11 * 8 + 4);
  __n = extraout_RDX;
  if (uVar9 != 0) {
    ppRVar6 = &pRVar1->generic + uVar11;
    __s2 = (void *)*in_R8;
    sVar3 = in_R8[1];
    do {
      if ((uVar9 != 1) && (*(uint *)ppRVar6 == uVar4)) {
        lVar7 = (ulong)(uVar9 - 2) * 0x50;
        __n = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
              ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (MVar12.ptr.field_1.value + 8 + lVar7))->value;
        if (__n.value == sVar3) {
          if (__n.value != 0) {
            iVar5 = bcmp(*(void **)(lVar7 + MVar12.ptr.field_1.value),__s2,__n.value);
            __n = extraout_RDX_00;
            if (iVar5 != 0) goto LAB_0018a36a;
          }
          *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x1;
          *(ulong *)(this + 8) = (ulong)(uVar9 - 2);
          goto LAB_0018a3a3;
        }
      }
LAB_0018a36a:
      uVar10 = uVar11 + 1;
      uVar11 = uVar10 & 0xffffffff;
      if (uVar10 == uVar2) {
        uVar11 = 0;
      }
      ppRVar6 = &pRVar1->generic + uVar11;
      uVar9 = *(uint *)((long)ppRVar6 + 4);
    } while (uVar9 != 0);
  }
  *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0;
LAB_0018a3a3:
  MVar13.ptr.field_1.value = __n.value;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }